

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

string * sha256(string *__return_storage_ptr__,string *input)

{
  int i;
  long lVar1;
  byte *__s;
  uchar digest [32];
  char buf [65];
  allocator local_139;
  byte local_138 [96];
  undefined1 local_d8;
  SHA256 local_c8;
  
  local_c8.m_block[0x70] = '\0';
  local_c8.m_block[0x71] = '\0';
  local_c8.m_block[0x72] = '\0';
  local_c8.m_block[0x73] = '\0';
  local_c8.m_block[0x74] = '\0';
  local_c8.m_block[0x75] = '\0';
  local_c8.m_block[0x76] = '\0';
  local_c8.m_block[0x77] = '\0';
  local_c8.m_block[0x78] = '\0';
  local_c8.m_block[0x79] = '\0';
  local_c8.m_block[0x7a] = '\0';
  local_c8.m_block[0x7b] = '\0';
  local_c8.m_block[0x7c] = '\0';
  local_c8.m_block[0x7d] = '\0';
  local_c8.m_block[0x7e] = '\0';
  local_c8.m_block[0x7f] = '\0';
  local_c8.m_block[0x60] = '\0';
  local_c8.m_block[0x61] = '\0';
  local_c8.m_block[0x62] = '\0';
  local_c8.m_block[99] = '\0';
  local_c8.m_block[100] = '\0';
  local_c8.m_block[0x65] = '\0';
  local_c8.m_block[0x66] = '\0';
  local_c8.m_block[0x67] = '\0';
  local_c8.m_block[0x68] = '\0';
  local_c8.m_block[0x69] = '\0';
  local_c8.m_block[0x6a] = '\0';
  local_c8.m_block[0x6b] = '\0';
  local_c8.m_block[0x6c] = '\0';
  local_c8.m_block[0x6d] = '\0';
  local_c8.m_block[0x6e] = '\0';
  local_c8.m_block[0x6f] = '\0';
  local_c8.m_block[0x50] = '\0';
  local_c8.m_block[0x51] = '\0';
  local_c8.m_block[0x52] = '\0';
  local_c8.m_block[0x53] = '\0';
  local_c8.m_block[0x54] = '\0';
  local_c8.m_block[0x55] = '\0';
  local_c8.m_block[0x56] = '\0';
  local_c8.m_block[0x57] = '\0';
  local_c8.m_block[0x58] = '\0';
  local_c8.m_block[0x59] = '\0';
  local_c8.m_block[0x5a] = '\0';
  local_c8.m_block[0x5b] = '\0';
  local_c8.m_block[0x5c] = '\0';
  local_c8.m_block[0x5d] = '\0';
  local_c8.m_block[0x5e] = '\0';
  local_c8.m_block[0x5f] = '\0';
  local_c8.m_block[0x40] = '\0';
  local_c8.m_block[0x41] = '\0';
  local_c8.m_block[0x42] = '\0';
  local_c8.m_block[0x43] = '\0';
  local_c8.m_block[0x44] = '\0';
  local_c8.m_block[0x45] = '\0';
  local_c8.m_block[0x46] = '\0';
  local_c8.m_block[0x47] = '\0';
  local_c8.m_block[0x48] = '\0';
  local_c8.m_block[0x49] = '\0';
  local_c8.m_block[0x4a] = '\0';
  local_c8.m_block[0x4b] = '\0';
  local_c8.m_block[0x4c] = '\0';
  local_c8.m_block[0x4d] = '\0';
  local_c8.m_block[0x4e] = '\0';
  local_c8.m_block[0x4f] = '\0';
  local_c8.m_block[0x30] = '\0';
  local_c8.m_block[0x31] = '\0';
  local_c8.m_block[0x32] = '\0';
  local_c8.m_block[0x33] = '\0';
  local_c8.m_block[0x34] = '\0';
  local_c8.m_block[0x35] = '\0';
  local_c8.m_block[0x36] = '\0';
  local_c8.m_block[0x37] = '\0';
  local_c8.m_block[0x38] = '\0';
  local_c8.m_block[0x39] = '\0';
  local_c8.m_block[0x3a] = '\0';
  local_c8.m_block[0x3b] = '\0';
  local_c8.m_block[0x3c] = '\0';
  local_c8.m_block[0x3d] = '\0';
  local_c8.m_block[0x3e] = '\0';
  local_c8.m_block[0x3f] = '\0';
  local_c8.m_block[0x20] = '\0';
  local_c8.m_block[0x21] = '\0';
  local_c8.m_block[0x22] = '\0';
  local_c8.m_block[0x23] = '\0';
  local_c8.m_block[0x24] = '\0';
  local_c8.m_block[0x25] = '\0';
  local_c8.m_block[0x26] = '\0';
  local_c8.m_block[0x27] = '\0';
  local_c8.m_block[0x28] = '\0';
  local_c8.m_block[0x29] = '\0';
  local_c8.m_block[0x2a] = '\0';
  local_c8.m_block[0x2b] = '\0';
  local_c8.m_block[0x2c] = '\0';
  local_c8.m_block[0x2d] = '\0';
  local_c8.m_block[0x2e] = '\0';
  local_c8.m_block[0x2f] = '\0';
  local_c8.m_block[0x10] = '\0';
  local_c8.m_block[0x11] = '\0';
  local_c8.m_block[0x12] = '\0';
  local_c8.m_block[0x13] = '\0';
  local_c8.m_block[0x14] = '\0';
  local_c8.m_block[0x15] = '\0';
  local_c8.m_block[0x16] = '\0';
  local_c8.m_block[0x17] = '\0';
  local_c8.m_block[0x18] = '\0';
  local_c8.m_block[0x19] = '\0';
  local_c8.m_block[0x1a] = '\0';
  local_c8.m_block[0x1b] = '\0';
  local_c8.m_block[0x1c] = '\0';
  local_c8.m_block[0x1d] = '\0';
  local_c8.m_block[0x1e] = '\0';
  local_c8.m_block[0x1f] = '\0';
  local_c8.m_block[0] = '\0';
  local_c8.m_block[1] = '\0';
  local_c8.m_block[2] = '\0';
  local_c8.m_block[3] = '\0';
  local_c8.m_block[4] = '\0';
  local_c8.m_block[5] = '\0';
  local_c8.m_block[6] = '\0';
  local_c8.m_block[7] = '\0';
  local_c8.m_block[8] = '\0';
  local_c8.m_block[9] = '\0';
  local_c8.m_block[10] = '\0';
  local_c8.m_block[0xb] = '\0';
  local_c8.m_block[0xc] = '\0';
  local_c8.m_block[0xd] = '\0';
  local_c8.m_block[0xe] = '\0';
  local_c8.m_block[0xf] = '\0';
  local_c8.m_h[0] = 0x6a09e667;
  local_c8.m_h[1] = 0xbb67ae85;
  local_c8.m_h[2] = 0x3c6ef372;
  local_c8.m_h[3] = 0xa54ff53a;
  local_c8.m_h[4] = 0x510e527f;
  local_c8.m_h[5] = 0x9b05688c;
  local_c8.m_h[6] = 0x1f83d9ab;
  local_c8.m_h[7] = 0x5be0cd19;
  local_c8.m_tot_len = 0;
  local_c8.m_len = 0;
  local_138[0x10] = 0;
  local_138[0x11] = 0;
  local_138[0x12] = 0;
  local_138[0x13] = 0;
  local_138[0x14] = 0;
  local_138[0x15] = 0;
  local_138[0x16] = 0;
  local_138[0x17] = 0;
  local_138[0x18] = 0;
  local_138[0x19] = 0;
  local_138[0x1a] = 0;
  local_138[0x1b] = 0;
  local_138[0x1c] = 0;
  local_138[0x1d] = 0;
  local_138[0x1e] = 0;
  local_138[0x1f] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  local_138[8] = 0;
  local_138[9] = 0;
  local_138[10] = 0;
  local_138[0xb] = 0;
  local_138[0xc] = 0;
  local_138[0xd] = 0;
  local_138[0xe] = 0;
  local_138[0xf] = 0;
  SHA256::update(&local_c8,(uchar *)(input->_M_dataplus)._M_p,(uint)input->_M_string_length);
  SHA256::final(&local_c8,local_138);
  __s = local_138 + 0x20;
  local_d8 = 0;
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    sprintf((char *)__s,"%02x",(ulong)local_138[lVar1]);
    __s = __s + 2;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)(local_138 + 0x20),&local_139);
  return __return_storage_ptr__;
}

Assistant:

std::string sha256(std::string input)
{
    unsigned char digest[SHA256::DIGEST_SIZE];
    memset(digest,0,SHA256::DIGEST_SIZE);
 
    SHA256 ctx = SHA256();
    ctx.init();
    ctx.update( (unsigned char*)input.c_str(), input.length());
    ctx.final(digest);
 
    char buf[2*SHA256::DIGEST_SIZE+1];
    buf[2*SHA256::DIGEST_SIZE] = 0;
    for (int i = 0; i < SHA256::DIGEST_SIZE; i++)
        sprintf(buf+i*2, "%02x", digest[i]);
    return std::string(buf);
}